

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_case.h
# Opt level: O1

test_result * __thiscall
ut::test_case_impl<agge::tests::RendererParallelTests>::execute
          (test_result *__return_storage_ptr__,
          test_case_impl<agge::tests::RendererParallelTests> *this)

{
  setup_impl<agge::tests::RendererParallelTests> *psVar1;
  size_t __n;
  test_result *ptVar2;
  registry *prVar3;
  code *pcVar4;
  char *__dest;
  ulong *puVar5;
  RendererParallelTests f;
  string outcome;
  undefined1 local_9b [11];
  size_t local_90;
  undefined1 local_88 [16];
  test_result *local_78;
  
  local_9b._3_8_ = local_88;
  local_90 = 0;
  local_88[0] = 0;
  local_78 = __return_storage_ptr__;
  prVar3 = registry_instance();
  registry::add_test<agge::tests::RendererParallelTests>
            (prVar3,(offset_in_RendererParallelTests_to_subr)
                    agge::tests::RendererParallelTests::SingleThreadedRenderingIsDoneInSingleThread,
             (char *)0x0);
  prVar3 = registry_instance();
  registry::add_test<agge::tests::RendererParallelTests>
            (prVar3,(offset_in_RendererParallelTests_to_subr)
                    agge::tests::RendererParallelTests::
                    RowsAreProcessedInInterlacedOrderInDedicatedThreads,(char *)0x0);
  prVar3 = registry_instance();
  registry::add_test<agge::tests::RendererParallelTests>
            (prVar3,(offset_in_RendererParallelTests_to_subr)
                    agge::tests::RendererParallelTests::
                    RendererPopulatesBitmapWithMaskDataAccordingToWindow,(char *)0x0);
  psVar1 = (this->_setup)._ptr;
  puVar5 = (psVar1->_inits).
           super__Vector_base<void_(agge::tests::RendererParallelTests::*)(),_std::allocator<void_(agge::tests::RendererParallelTests::*)()>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar5 != (psVar1->_inits).
                super__Vector_base<void_(agge::tests::RendererParallelTests::*)(),_std::allocator<void_(agge::tests::RendererParallelTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      pcVar4 = (code *)*puVar5;
      if (((ulong)pcVar4 & 1) != 0) {
        pcVar4 = *(code **)(pcVar4 + *(long *)(local_9b + puVar5[1]) + -1);
      }
      (*pcVar4)();
      puVar5 = puVar5 + 2;
    } while (puVar5 != (psVar1->_inits).
                       super__Vector_base<void_(agge::tests::RendererParallelTests::*)(),_std::allocator<void_(agge::tests::RendererParallelTests::*)()>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  pcVar4 = (code *)this->_method;
  if (((ulong)pcVar4 & 1) != 0) {
    pcVar4 = *(code **)(pcVar4 + *(long *)(local_9b + *(long *)&this->field_0x10) + -1);
  }
  (*pcVar4)();
  psVar1 = (this->_setup)._ptr;
  for (puVar5 = (psVar1->_teardowns).
                super__Vector_base<void_(agge::tests::RendererParallelTests::*)(),_std::allocator<void_(agge::tests::RendererParallelTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_start; ptVar2 = local_78, __n = local_90,
      puVar5 != (psVar1->_teardowns).
                super__Vector_base<void_(agge::tests::RendererParallelTests::*)(),_std::allocator<void_(agge::tests::RendererParallelTests::*)()>_>
                ._M_impl.super__Vector_impl_data._M_finish; puVar5 = puVar5 + 2) {
    pcVar4 = (code *)*puVar5;
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *(long *)(local_9b + puVar5[1]) + -1);
    }
    (*pcVar4)();
  }
  *(byte *)local_78 = *(byte *)local_78 & 0xf8 | 7;
  __dest = (char *)operator_new__(local_90 + 1);
  (ptVar2->outcome)._text = __dest;
  if (__n != 0) {
    memmove(__dest,(void *)local_9b._3_8_,__n);
  }
  __dest[__n] = '\0';
  (ptVar2->outcome)._deleter = exportable::immutable_basic_string<char>::deallocate;
  if ((undefined1 *)local_9b._3_8_ != local_88) {
    operator_delete((void *)local_9b._3_8_);
  }
  return ptVar2;
}

Assistant:

inline test_result test_case_impl<Fixture>::execute()
	{
		bool initialized = false;
		bool passed = false;
		bool terminated = false;
		std::string outcome;

		try
		{
			Fixture f;

			try
			{
				_setup->init(f);
				initialized = true;

				try
				{
					(f.*_method)();
					passed = true;
				}
				catch (const std::exception &e)
				{
					outcome = e.what();
				}
				catch (...)
				{
					outcome = "Test Failed!";
				}

				try
				{
					_setup->teardown(f);
					terminated = true;
				}
				catch (const std::exception &e)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += std::string("Teardown Failed: ") + e.what();
				}
				catch (...)
				{
					outcome += outcome.empty() ? "" : "\n";
					outcome += "Teardown Failed!";
				}
			}
			catch (const std::exception &e)
			{
				outcome = std::string("Initialization Failed: ") + e.what();
			}
			catch (...)
			{
				outcome = "Initialization Failed!";
			}
		}
		catch (...)
		{
		}
		return test_result(initialized, passed, terminated, outcome);
	}